

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr * __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler>::
ReadLogicalExpr_abi_cxx11_
          (LogicalExpr *__return_storage_ptr__,
          NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler> *this)

{
  long *plVar1;
  char *pcVar2;
  int opcode;
  double dVar3;
  bool local_38 [24];
  ArgList local_20;
  
  local_20.field_1.values_ = (Value *)local_38;
  plVar1 = *(long **)this;
  pcVar2 = (char *)*plVar1;
  plVar1[3] = (long)pcVar2;
  *plVar1 = (long)(pcVar2 + 1);
  switch(*pcVar2) {
  case 'l':
  case 'n':
  case 's':
    dVar3 = NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler>::ReadConstant
                      ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler> *)this,
                       *pcVar2);
    local_38[0] = dVar3 != 0.0;
    fmt::format<bool>(__return_storage_ptr__,(CStringRef)0x26c150,local_38);
    break;
  default:
    local_38[0] = false;
    local_38[1] = false;
    local_38[2] = false;
    local_38[3] = false;
    local_38[4] = false;
    local_38[5] = false;
    local_38[6] = false;
    local_38[7] = false;
    local_38[8] = false;
    local_38[9] = false;
    local_38[10] = false;
    local_38[0xb] = false;
    local_38[0xc] = false;
    local_38[0xd] = false;
    local_38[0xe] = false;
    local_38[0xf] = false;
    local_20.types_ = 0;
    TextReader<fmt::Locale>::DoReportError
              (*(TextReader<fmt::Locale> **)this,
               ((*(TextReader<fmt::Locale> **)this)->super_ReaderBase).token_,(CStringRef)0x26490e,
               &local_20);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    break;
  case 'o':
    opcode = NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler>::ReadOpCode
                       ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler> *)this);
    ReadLogicalExpr_abi_cxx11_(__return_storage_ptr__,this,opcode);
  }
  return __return_storage_ptr__;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}